

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall
binlog::PrettyPrinter::printUTCTime(PrettyPrinter *this,OstreamBuffer *out,uint64_t clockValue)

{
  nanoseconds sinceEpoch;
  BrokenDownTime bdt;
  BrokenDownTime local_58;
  
  if (0 < (long)this->_clockSync->clockFrequency) {
    local_58.super_tm.tm_zone = (char *)0x0;
    local_58.tm_nsec = 0;
    local_58._60_4_ = 0;
    local_58.super_tm.tm_isdst = 0;
    local_58.super_tm._36_4_ = 0;
    local_58.super_tm.tm_gmtoff = 0;
    local_58.super_tm.tm_mon = 0;
    local_58.super_tm.tm_year = 0;
    local_58.super_tm.tm_wday = 0;
    local_58.super_tm.tm_yday = 0;
    local_58.super_tm.tm_sec = 0;
    local_58.super_tm.tm_min = 0;
    local_58.super_tm.tm_hour = 0;
    local_58.super_tm.tm_mday = 0;
    sinceEpoch = clockToNsSinceEpoch(this->_clockSync,clockValue);
    nsSinceEpochToBrokenDownTimeUTC(sinceEpoch,&local_58);
    printTime(this,out,&local_58,0,"UTC");
    return;
  }
  detail::OstreamBuffer::operator<<(out,"no_clock_sync?");
  return;
}

Assistant:

void PrettyPrinter::printUTCTime(detail::OstreamBuffer& out, std::uint64_t clockValue) const
{
  // TODO(benedek) perf: cache bdt, update instead of complete recompute

  if (std::int64_t(_clockSync->clockFrequency) > 0)
  {
    BrokenDownTime bdt{};
    const std::chrono::nanoseconds sinceEpoch = clockToNsSinceEpoch(*_clockSync, clockValue);
    nsSinceEpochToBrokenDownTimeUTC(sinceEpoch, bdt);
    printTime(out, bdt, 0, "UTC");
  }
  else
  {
    out << "no_clock_sync?";
  }
}